

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_art.hpp
# Opt level: O0

bool __thiscall
unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::insert_internal
          (mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          art_key_type k,value_type v)

{
  bool bVar1;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> guard;
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  value_type v_local;
  art_key_type k_local;
  
  guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_30,&this->mutex);
  bVar1 = db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::insert_internal
                    (&this->db_,(art_key_type)k.field_0,v);
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return bVar1;
}

Assistant:

[[nodiscard]] auto insert_internal(art_key_type k, value_type v) {
    const std::lock_guard guard{mutex};
    return db_.insert_internal(k, v);
  }